

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetEffectSourcePrivate::draw(QWidgetEffectSourcePrivate *this,QPainter *painter)

{
  bool bVar1;
  pointer pQVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QPainter *unaff_retaddr;
  QWidget *in_stack_00000008;
  QWidgetPrivate *wd;
  QRegion toBePainted;
  RenderFlags in_stack_0000009c;
  QPainter *in_stack_000000c0;
  QPoint *in_stack_000000c8;
  QRegion *in_stack_000000d0;
  QPaintDevice *in_stack_000000d8;
  QWidgetPrivate *in_stack_000000e0;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> in_stack_0000034c;
  QWidgetRepaintManager *in_stack_00000380;
  QFlags<QWidget::RenderFlag> *in_stack_ffffffffffffff88;
  QPoint *this_00;
  QFlag QVar3;
  QWidget *in_stack_ffffffffffffffa8;
  QRect local_38;
  QRegion local_28;
  QFlag local_20 [2];
  QRegion local_18;
  QRegion *in_stack_fffffffffffffff0;
  QPoint *targetOffset;
  
  targetOffset = *(QPoint **)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI + 0x98) == 0) || (*(long *)(*(long *)(in_RDI + 0x98) + 0x30) != in_RSI)) {
    this_00 = *(QPoint **)(in_RDI + 0x90);
    QPoint::QPoint(this_00);
    QVar3.i = (int)((ulong)this_00 >> 0x20);
    QRegion::QRegion(&local_18);
    QFlag::QFlag(local_20,3);
    QFlags<QWidget::RenderFlag>::QFlagsStorageHelper(in_stack_ffffffffffffff88,QVar3);
    QWidget::render(in_stack_00000008,unaff_retaddr,targetOffset,in_stack_fffffffffffffff0,
                    in_stack_0000009c);
    QRegion::~QRegion(&local_18);
  }
  else {
    local_28.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_28,(QRegion *)(*(long *)(in_RDI + 0x98) + 8));
    local_38 = QWidget::rect(in_stack_ffffffffffffffa8);
    QRegion::operator&=(&local_28,(QRect *)&local_38);
    qt_widget_private((QWidget *)0x370a85);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x370a98);
    if ((bVar1) &&
       (pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x370aac),
       (*(ushort *)&pQVar2->field_0x7c >> 7 & 1) != 0)) {
      pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x370ace);
      QRegion::operator&=(&local_28,(QRegion *)&pQVar2->mask);
    }
    QWidgetPrivate::drawWidget
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
               (DrawWidgetFlags)in_stack_0000034c.i,in_stack_000000c0,in_stack_00000380);
    QRegion::~QRegion(&local_28);
  }
  if (*(QPoint **)(in_FS_OFFSET + 0x28) != targetOffset) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetEffectSourcePrivate::draw(QPainter *painter)
{
    if (!context || context->painter != painter) {
        m_widget->render(painter);
        return;
    }

    // The region saved in the context is neither clipped to the rect
    // nor the mask, so we have to clip it here before calling drawWidget.
    QRegion toBePainted = context->rgn;
    toBePainted &= m_widget->rect();
    QWidgetPrivate *wd = qt_widget_private(m_widget);
    if (wd->extra && wd->extra->hasMask)
        toBePainted &= wd->extra->mask;

    wd->drawWidget(context->pdev, toBePainted, context->offset, context->flags,
                   context->sharedPainter, context->repaintManager);
}